

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void Memory::
     DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,SListCounted<Loop::MemOpCandidate*,Memory::ArenaAllocator>>
               (AllocatorType *allocator,
               SListCounted<Loop::MemOpCandidate_*,_Memory::ArenaAllocator> *obj)

{
  size_t sVar1;
  long *plVar2;
  long extraout_RDX;
  code *local_40;
  FreeFuncType freeFunc;
  SListCounted<Loop::MemOpCandidate_*,_Memory::ArenaAllocator> *obj_local;
  AllocatorType *allocator_local;
  
  SListCounted<Loop::MemOpCandidate_*,_Memory::ArenaAllocator>::~SListCounted(obj);
  local_40 = (code *)TypeAllocatorFunc<Memory::JitArenaAllocator,_SListCounted<Loop::MemOpCandidate_*,_Memory::ArenaAllocator>_>
                     ::GetFreeFunc();
  plVar2 = (long *)((long)&(allocator->super_ArenaAllocator).
                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                           super_Allocator.outOfMemoryFunc + extraout_RDX);
  if (((ulong)local_40 & 1) != 0) {
    local_40 = *(code **)(local_40 + *plVar2 + -1);
  }
  sVar1 = _AllocatorDelete<SListCounted<Loop::MemOpCandidate_*,_Memory::ArenaAllocator>,_(Memory::AllocatorDeleteFlags)0>
          ::Size();
  (*local_40)(plVar2,obj,sVar1);
  return;
}

Assistant:

void DeleteObject(typename AllocatorInfo<TAllocator, T>::AllocatorType * allocator, T * obj)
{
    obj->~T();

    auto freeFunc = AllocatorInfo<TAllocator, T>::InstAllocatorFunc::GetFreeFunc(); // Use InstAllocatorFunc
    (allocator->*freeFunc)(
        (void*)obj, _AllocatorDelete<T, deleteFlags>::Size());
}